

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O0

void Dau_DsdInsertVarCache(Dau_Dsd_t *p,int v,int u,int Status)

{
  int Status_local;
  int u_local;
  int v_local;
  Dau_Dsd_t *p_local;
  
  if (v == u) {
    __assert_fail("v != u",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                  ,0x459,"void Dau_DsdInsertVarCache(Dau_Dsd_t *, int, int, int)");
  }
  if ((0 < Status) && (Status < 4)) {
    if (p->Cache[v][u] == '\0') {
      p->Cache[v][u] = (char)Status;
      return;
    }
    __assert_fail("p->Cache[v][u] == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                  ,0x45b,"void Dau_DsdInsertVarCache(Dau_Dsd_t *, int, int, int)");
  }
  __assert_fail("Status > 0 && Status < 4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                ,0x45a,"void Dau_DsdInsertVarCache(Dau_Dsd_t *, int, int, int)");
}

Assistant:

static inline void Dau_DsdInsertVarCache( Dau_Dsd_t * p, int v, int u, int Status )
{
    assert( v != u );
    assert( Status > 0 && Status < 4 );
    assert( p->Cache[v][u] == 0 );
    p->Cache[v][u] = Status;
}